

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.hh
# Opt level: O1

void __thiscall kratos::IRNode::~IRNode(IRNode *this)

{
  ~IRNode(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

virtual ~IRNode() = default;